

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeFormatter.cpp
# Opt level: O1

void __thiscall
cali::TreeFormatter::TreeFormatterImpl::TreeFormatterImpl(TreeFormatterImpl *this,QuerySpec *spec)

{
  _Rb_tree_header *p_Var1;
  
  SnapshotTree::SnapshotTree(&this->m_tree);
  QuerySpec::QuerySpec(&this->m_spec,spec);
  p_Var1 = &(this->m_column_info)._M_t._M_impl.super__Rb_tree_header;
  (this->m_column_info)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_column_info)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_column_info)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_column_info)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_column_info)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_path_column_width = 0;
  this->m_max_column_width = 0x30;
  p_Var1 = &(this->m_aliases)._M_t._M_impl.super__Rb_tree_header;
  (this->m_aliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_aliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_aliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_aliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_aliases)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_use_nested = true;
  this->m_print_globals = false;
  (this->m_path_key_names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_path_key_names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_path_key_names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_path_keys).super__Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_path_keys).super__Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_path_keys).super__Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_sort_info).
  super__Vector_base<cali::TreeFormatter::TreeFormatterImpl::SortInfo,_std::allocator<cali::TreeFormatter::TreeFormatterImpl::SortInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_sort_info).
  super__Vector_base<cali::TreeFormatter::TreeFormatterImpl::SortInfo,_std::allocator<cali::TreeFormatter::TreeFormatterImpl::SortInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_sort_info).
  super__Vector_base<cali::TreeFormatter::TreeFormatterImpl::SortInfo,_std::allocator<cali::TreeFormatter::TreeFormatterImpl::SortInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_path_key_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_path_key_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_path_key_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_path_key_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_path_key_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  configure(this,spec);
  return;
}

Assistant:

TreeFormatterImpl(const QuerySpec& spec)
        : m_spec(spec), m_path_column_width(0), m_max_column_width(48), m_use_nested(true), m_print_globals(false)
    {
        configure(spec);
    }